

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILayer.cpp
# Opt level: O2

void __thiscall ILayer::ILayer(ILayer *this,LayerMeta *_meta)

{
  int iVar1;
  undefined4 extraout_var;
  int idx;
  ulong uVar2;
  
  this->_vptr_ILayer = (_func_int **)&PTR__ILayer_00118b00;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LayerStats::LayerStats(&this->stats);
  LayerMeta::LayerMeta(&this->meta,_meta);
  std::vector<INeuron_*,_std::allocator<INeuron_*>_>::resize(&this->neurons,(this->meta).size);
  for (uVar2 = 0; uVar2 < (this->meta).size; uVar2 = uVar2 + 1) {
    iVar1 = (**((this->meta).neuronBuilder)->_vptr_INeuronBuilder)();
    (this->neurons).super__Vector_base<INeuron_*,_std::allocator<INeuron_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar2] = (INeuron *)CONCAT44(extraout_var,iVar1);
  }
  return;
}

Assistant:

ILayer::ILayer( LayerMeta _meta ) : meta( std::move(_meta) )
{
    neurons.resize( meta.size );
    for ( auto idx = 0; idx < meta.size; ++idx ) {
        neurons[idx] = meta.neuronBuilder.build();
    }
}